

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

void __thiscall QString::reallocData(QString *this,qsizetype alloc,AllocationOption option)

{
  QArrayData *data;
  bool bVar1;
  bool bVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  long lVar5;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar6;
  QArrayData *d;
  QArrayDataPointer<char16_t> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (alloc == 0) {
    local_48.d = (Data *)0x0;
    local_48.ptr = L"";
    local_48.size = 0;
    QArrayDataPointer<char16_t>::operator=(&this->d,&local_48);
  }
  else {
    data = &((this->d).d)->super_QArrayData;
    if (data == (QArrayData *)0x0) {
      bVar2 = false;
      bVar1 = true;
    }
    else {
      pcVar3 = (this->d).ptr;
      pcVar4 = (char16_t *)((ulong)((long)&data[1].alloc + 7U) & 0xfffffffffffffff0);
      bVar2 = pcVar3 != pcVar4 && -1 < (long)pcVar3 - (long)pcVar4;
      bVar1 = 1 < (data->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if (!(bool)(bVar2 | bVar1)) {
      pVar6 = QArrayData::reallocateUnaligned(data,(this->d).ptr,2,alloc,option);
      (this->d).d = (Data *)pVar6.first;
      (this->d).ptr = (char16_t *)pVar6.second;
      goto LAB_0011f7aa;
    }
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    lVar5 = (this->d).size;
    if (alloc <= lVar5) {
      lVar5 = alloc;
    }
    local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar3 = (char16_t *)QArrayData::allocate2(&local_30,alloc,option);
    local_48.d = (Data *)local_30;
    local_48.ptr = pcVar3;
    local_48.size = lVar5;
    if (0 < lVar5) {
      memcpy(pcVar3,(this->d).ptr,lVar5 * 2);
    }
    pcVar3[lVar5] = L'\0';
    QArrayDataPointer<char16_t>::operator=(&this->d,&local_48);
  }
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0011f7aa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QString::reallocData(qsizetype alloc, QArrayData::AllocationOption option)
{
    if (!alloc) {
        d = DataPointer::fromRawData(&_empty, 0);
        return;
    }

    // don't use reallocate path when reducing capacity and there's free space
    // at the beginning: might shift data pointer outside of allocated space
    const bool cannotUseReallocate = d.freeSpaceAtBegin() > 0;

    if (d->needsDetach() || cannotUseReallocate) {
        DataPointer dd(alloc, qMin(alloc, d.size), option);
        Q_CHECK_PTR(dd.data());
        if (dd.size > 0)
            ::memcpy(dd.data(), d.data(), dd.size * sizeof(QChar));
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(alloc, option);
    }
}